

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O2

void button_mask_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Am_Value *pAVar8;
  undefined4 extraout_var;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  Am_Style local_58;
  int local_4c;
  int local_48;
  Am_Widget_Look look;
  Am_Image_Array local_40;
  Am_Font font;
  ulong uVar9;
  
  local_4c = x_offset;
  local_48 = y_offset;
  pAVar8 = Am_Object::Get(self,100,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x65,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x66,0);
  uVar6 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x67,0);
  iVar7 = Am_Value::operator_cast_to_int(pAVar8);
  uVar9 = CONCAT44(extraout_var,iVar7);
  pAVar8 = Am_Object::Get(self,0x17c,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar8);
  pAVar8 = Am_Object::Get(self,0x180,0);
  bVar2 = Am_Value::operator_cast_to_bool(pAVar8);
  pAVar8 = Am_Object::Get(self,0x1c7,0);
  bVar3 = Am_Value::operator_cast_to_bool(pAVar8);
  pAVar8 = Am_Object::Get(self,0xac,0);
  Am_Font::Am_Font(&font,pAVar8);
  pAVar8 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&look,pAVar8);
  uVar11 = iVar4 + local_4c;
  uVar12 = iVar5 + local_48;
  if (look.value == Am_MOTIF_LOOK_val) {
    if (bVar2 || !bVar3) {
      if (bVar1 || (!bVar2 || !bVar3)) goto LAB_002623b7;
      uVar11 = uVar11 + 2;
      uVar12 = uVar12 + 2;
      uVar10 = (ulong)(uVar6 - 4);
      uVar9 = (ulong)(iVar7 - 4);
    }
    else {
      if (bVar1) {
        (*drawonable->_vptr_Am_Drawonable[0x2c])
                  (drawonable,&Am_Key_Border_Line,&Am_No_Style,(ulong)uVar11,(ulong)uVar12,
                   (ulong)uVar6,uVar9,7);
      }
      uVar11 = uVar11 + 7;
      uVar12 = uVar12 + 7;
      uVar10 = (ulong)(uVar6 - 0xe);
      uVar9 = (ulong)(iVar7 - 0xe);
    }
  }
  else {
    if (look.value != Am_WINDOWS_LOOK_val) {
      if (look.value != Am_MACINTOSH_LOOK_val) {
        Am_Error("Unknown Look parameter");
      }
      if (bVar3 || bVar2) {
        if (bVar2) {
          if ((button_mask_proc(Am_Object,Am_Drawonable*,int,int)::thick == '\0') &&
             (iVar4 = __cxa_guard_acquire(&button_mask_proc(Am_Object,Am_Drawonable*,int,int)::thick
                                         ), iVar4 != 0)) {
            Am_Image_Array::Am_Image_Array(&local_40,&Am_No_Image);
            Am_Style::Am_Style(&local_58,"black",3,Am_CAP_BUTT,Am_JOIN_MITER,Am_LINE_SOLID,
                               "\x04\x04",2,Am_FILL_SOLID,Am_FILL_POLY_EVEN_ODD,
                               (Am_Image_Array_Data *)&local_40);
            Am_Style::Clone_With_New_Color(&button_mask_proc::thick,&local_58);
            Am_Style::~Am_Style(&local_58);
            Am_Image_Array::~Am_Image_Array(&local_40);
            __cxa_atexit(Am_Style::~Am_Style,&button_mask_proc::thick,&__dso_handle);
            __cxa_guard_release(&button_mask_proc(Am_Object,Am_Drawonable*,int,int)::thick);
          }
          (*drawonable->_vptr_Am_Drawonable[0x2d])
                    (drawonable,&button_mask_proc::thick,&Am_No_Style,(ulong)uVar11,(ulong)uVar12,
                     (ulong)uVar6,uVar9,8,8,0);
        }
        uVar11 = uVar11 + 4;
        uVar12 = uVar12 + 4;
        uVar6 = uVar6 - 8;
        uVar9 = (ulong)(iVar7 - 8);
      }
      (*drawonable->_vptr_Am_Drawonable[0x2d])
                (drawonable,&Am_On_Bits,&Am_On_Bits,(ulong)uVar11,(ulong)uVar12,(ulong)uVar6,uVar9,5
                 ,5,0);
      goto LAB_00262497;
    }
LAB_002623b7:
    uVar10 = (ulong)uVar6;
  }
  (*drawonable->_vptr_Am_Drawonable[0x2c])
            (drawonable,&Am_No_Style,&Am_On_Bits,(ulong)uVar11,(ulong)uVar12,uVar10,uVar9,0);
LAB_00262497:
  Am_Font::~Am_Font(&font);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, button_mask,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);

  bool key_selected = self.Get(Am_KEY_SELECTED);
  bool is_default = self.Get(Am_DEFAULT);
  bool fringe = self.Get(Am_LEAVE_ROOM_FOR_FRINGE);

  Am_Font font(self.Get(Am_FONT));

  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    if (fringe && !is_default) {
      if (key_selected)
        drawonable->Draw_Rectangle(Am_Key_Border_Line, Am_No_Style, left, top,
                                   width, height, Am_DRAW_MASK_COPY);
      drawonable->Draw_Rectangle(Am_No_Style, Am_On_Bits,
                                 left + kMotDefault + kMotKeySel,
                                 top + kMotDefault + kMotKeySel,
                                 width - 2 * (kMotDefault + kMotKeySel),
                                 height - 2 * (kMotDefault + kMotKeySel));
    } else if (fringe && is_default && !key_selected)
      drawonable->Draw_Rectangle(Am_No_Style, Am_On_Bits, left + kMotKeySel,
                                 top + kMotKeySel, width - 2 * kMotKeySel,
                                 height - 2 * kMotKeySel);
    else
      drawonable->Draw_Rectangle(Am_No_Style, Am_On_Bits, left, top, width,
                                 height);
    break;

  case Am_WINDOWS_LOOK_val:
    drawonable->Draw_Rectangle(Am_No_Style, Am_On_Bits, left, top, width,
                               height);
    break;

  case Am_MACINTOSH_LOOK_val:
    if (fringe || is_default) {
      if (is_default) {
        static Am_Style thick =
            Am_Style("black", 3).Clone_With_New_Color(Am_On_Bits);
        drawonable->Draw_Roundtangle(thick, Am_No_Style, left, top, width,
                                     height, 8, 8);
      }
      drawonable->Draw_Roundtangle(Am_On_Bits, Am_On_Bits, left + kMacDefault,
                                   top + kMacDefault, width - 2 * kMacDefault,
                                   height - 2 * kMacDefault, 5, 5);
    } else
      drawonable->Draw_Roundtangle(Am_On_Bits, Am_On_Bits, left, top, width,
                                   height, 5, 5);
    break;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
}